

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_expression_classes.hpp
# Opt level: O0

void __thiscall
remora::
matrix_matrix_prod<remora::dense_triangular_proxy<double_const,remora::row_major,remora::triangular_tag<false,false>,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
::
plus_assign_to<remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>>
          (void *param_1)

{
  multiply_and_add<double> multiply;
  type temp;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff78;
  multiply_and_add<double> in_stack_ffffffffffffff88;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff90;
  dense_triangular_proxy<const_double,_remora::row_major,_remora::triangular_tag<false,_false>,_remora::cpu_tag>
  *in_stack_ffffffffffffffa0;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffa8;
  matrix<double,_remora::row_major,_remora::cpu_tag> *in_stack_ffffffffffffffb0;
  
  matrix<double,remora::row_major,remora::cpu_tag>::
  matrix<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  dense_triangular_proxy<const_double,_remora::row_major,_remora::triangular_tag<false,_false>,_remora::cpu_tag>
  ::to_dense(in_stack_ffffffffffffffa0);
  kernels::
  trmm<false,false,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>>
            ((matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)param_1,in_stack_ffffffffffffff78);
  device_traits<remora::cpu_tag>::multiply_and_add<double>::multiply_and_add
            ((multiply_and_add<double> *)&stack0xffffffffffffff88,*(double *)((long)param_1 + 0x40))
  ;
  kernels::
  assign<remora::device_traits<remora::cpu_tag>::multiply_and_add<double>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
            (in_stack_ffffffffffffff90,
             (matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
              *)in_stack_ffffffffffffff88.scalar,(multiply_and_add<double> *)param_1);
  matrix<double,_remora::row_major,_remora::cpu_tag>::~matrix
            ((matrix<double,_remora::row_major,_remora::cpu_tag> *)0x11def1);
  return;
}

Assistant:

void plus_assign_to(matrix_expression<MatX, device_type>& X, triangular_structure, dense_tag )const{
		//computation of trmm is in-place so we need a temporary for plus-assign.
		typename matrix_temporary<MatX>::type temp = m_rhs;
		kernels::trmm<MatA::orientation::is_upper, MatA::orientation::is_unit>(m_lhs.to_dense(), temp);
		
		//perform plus-assignment of temporary
		typename device_traits<device_type>:: template multiply_and_add<value_type> multiply(m_alpha);
		kernels::assign(X, temp, multiply);
	}